

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void ts_tree_edit(TSTree *self,TSInputEdit *edit)

{
  TSRange *pTVar1;
  TSPoint TVar2;
  Subtree SVar3;
  undefined1 local_78 [8];
  SubtreePool pool;
  TSRange *range;
  uint i;
  TSInputEdit *edit_local;
  TSTree *self_local;
  
  for (range._4_4_ = 0; range._4_4_ < self->included_range_count; range._4_4_ = range._4_4_ + 1) {
    pTVar1 = self->included_ranges + range._4_4_;
    if (edit->old_end_byte <= pTVar1->end_byte) {
      if (pTVar1->end_byte != 0xffffffff) {
        pTVar1->end_byte = edit->new_end_byte + (pTVar1->end_byte - edit->old_end_byte);
        TVar2 = point_sub(pTVar1->end_point,edit->old_end_point);
        TVar2 = point_add(edit->new_end_point,TVar2);
        pTVar1->end_point = TVar2;
        if (pTVar1->end_byte < edit->new_end_byte) {
          pTVar1->end_byte = 0xffffffff;
          (pTVar1->end_point).row = 0xffffffff;
          (pTVar1->end_point).column = 0xffffffff;
        }
      }
      if (edit->old_end_byte <= pTVar1->start_byte) {
        pTVar1->start_byte = edit->new_end_byte + (pTVar1->start_byte - edit->old_end_byte);
        TVar2 = point_sub(pTVar1->start_point,edit->old_end_point);
        TVar2 = point_add(edit->new_end_point,TVar2);
        pTVar1->start_point = TVar2;
        if (pTVar1->start_byte < edit->new_end_byte) {
          pTVar1->start_byte = 0xffffffff;
          pool.tree_stack.size = 0xffffffff;
          pool.tree_stack.capacity = 0xffffffff;
          (pTVar1->start_point).row = 0xffffffff;
          (pTVar1->start_point).column = 0xffffffff;
        }
      }
    }
  }
  ts_subtree_pool_new((SubtreePool *)local_78,0);
  SVar3 = ts_subtree_edit(*(SubtreeInlineData *)&self->root,edit,(SubtreePool *)local_78);
  self->root = SVar3;
  self->parent_cache_start = 0;
  self->parent_cache_size = 0;
  ts_subtree_pool_delete((SubtreePool *)local_78);
  return;
}

Assistant:

void ts_tree_edit(TSTree *self, const TSInputEdit *edit) {
  for (unsigned i = 0; i < self->included_range_count; i++) {
    TSRange *range = &self->included_ranges[i];
    if (range->end_byte >= edit->old_end_byte) {
      if (range->end_byte != UINT32_MAX) {
        range->end_byte = edit->new_end_byte + (range->end_byte - edit->old_end_byte);
        range->end_point = point_add(
          edit->new_end_point,
          point_sub(range->end_point, edit->old_end_point)
        );
        if (range->end_byte < edit->new_end_byte) {
          range->end_byte = UINT32_MAX;
          range->end_point = POINT_MAX;
        }
      }
      if (range->start_byte >= edit->old_end_byte) {
        range->start_byte = edit->new_end_byte + (range->start_byte - edit->old_end_byte);
        range->start_point = point_add(
          edit->new_end_point,
          point_sub(range->start_point, edit->old_end_point)
        );
        if (range->start_byte < edit->new_end_byte) {
          range->start_byte = UINT32_MAX;
          range->start_point = POINT_MAX;
        }
      }
    }
  }

  SubtreePool pool = ts_subtree_pool_new(0);
  self->root = ts_subtree_edit(self->root, edit, &pool);
  self->parent_cache_start = 0;
  self->parent_cache_size = 0;
  ts_subtree_pool_delete(&pool);
}